

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

void __thiscall fsbridge::FileLock::~FileLock(FileLock *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fd != -1) {
    close(this->fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileLock::~FileLock()
{
    if (fd != -1) {
        close(fd);
    }
}